

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O0

uint masked_sad_ssse3(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                     int b_stride,uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int in_ECX;
  longlong in_RDX;
  int iVar12;
  longlong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int iVar13;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  int iVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar14 [16];
  __m128i alVar16;
  __m128i v_val_w;
  long in_stack_00000008;
  uint sad;
  __m128i pred;
  __m128i pred_r;
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  __m128i data_l;
  __m128i m_inv;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i mask_max;
  __m128i res;
  int y;
  int x;
  int local_21c;
  int local_218;
  long local_210;
  long local_200;
  long local_1f0;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 uStack_184;
  undefined1 uStack_183;
  undefined1 uStack_182;
  undefined1 uStack_181;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  int local_c8;
  int iStack_c0;
  
  iVar12 = (int)in_RSI;
  iVar13 = 0;
  iVar15 = 0;
  local_210 = in_R8;
  local_200 = in_RDX;
  local_1f0 = in_RDI;
  for (local_21c = 0; local_21c < (int)pred_r[0]; local_21c = local_21c + 1) {
    for (local_218 = 0; local_218 < (int)pred[1]; local_218 = local_218 + 0x10) {
      auVar11 = *(undefined1 (*) [16])(local_1f0 + local_218);
      uVar1 = *(undefined8 *)(local_200 + local_218);
      uVar2 = ((undefined8 *)(local_200 + local_218))[1];
      uVar3 = *(undefined8 *)(local_210 + local_218);
      uVar4 = ((undefined8 *)(local_210 + local_218))[1];
      uVar5 = *(undefined8 *)(in_stack_00000008 + local_218);
      uVar6 = ((undefined8 *)(in_stack_00000008 + local_218))[1];
      local_1c8 = (char)uVar5;
      cStack_1c7 = (char)((ulong)uVar5 >> 8);
      cStack_1c6 = (char)((ulong)uVar5 >> 0x10);
      cStack_1c5 = (char)((ulong)uVar5 >> 0x18);
      cStack_1c4 = (char)((ulong)uVar5 >> 0x20);
      cStack_1c3 = (char)((ulong)uVar5 >> 0x28);
      cStack_1c2 = (char)((ulong)uVar5 >> 0x30);
      cStack_1c1 = (char)((ulong)uVar5 >> 0x38);
      cStack_1c0 = (char)uVar6;
      cStack_1bf = (char)((ulong)uVar6 >> 8);
      cStack_1be = (char)((ulong)uVar6 >> 0x10);
      cStack_1bd = (char)((ulong)uVar6 >> 0x18);
      cStack_1bc = (char)((ulong)uVar6 >> 0x20);
      cStack_1bb = (char)((ulong)uVar6 >> 0x28);
      cStack_1ba = (char)((ulong)uVar6 >> 0x30);
      cStack_1b9 = (char)((ulong)uVar6 >> 0x38);
      local_178 = (undefined1)uVar1;
      uStack_177 = (undefined1)((ulong)uVar1 >> 8);
      uStack_176 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_175 = (undefined1)((ulong)uVar1 >> 0x18);
      uStack_174 = (undefined1)((ulong)uVar1 >> 0x20);
      uStack_173 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_172 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_171 = (undefined1)((ulong)uVar1 >> 0x38);
      local_188 = (undefined1)uVar3;
      uStack_187 = (undefined1)((ulong)uVar3 >> 8);
      uStack_186 = (undefined1)((ulong)uVar3 >> 0x10);
      uStack_185 = (undefined1)((ulong)uVar3 >> 0x18);
      uStack_184 = (undefined1)((ulong)uVar3 >> 0x20);
      uStack_183 = (undefined1)((ulong)uVar3 >> 0x28);
      uStack_182 = (undefined1)((ulong)uVar3 >> 0x30);
      uStack_181 = (undefined1)((ulong)uVar3 >> 0x38);
      auVar9[1] = local_188;
      auVar9[0] = local_178;
      auVar9[2] = uStack_177;
      auVar9[3] = uStack_187;
      auVar9[4] = uStack_176;
      auVar9[5] = uStack_186;
      auVar9[6] = uStack_175;
      auVar9[7] = uStack_185;
      auVar9[9] = uStack_184;
      auVar9[8] = uStack_174;
      auVar9[10] = uStack_173;
      auVar9[0xb] = uStack_183;
      auVar9[0xc] = uStack_172;
      auVar9[0xd] = uStack_182;
      auVar9[0xe] = uStack_171;
      auVar9[0xf] = uStack_181;
      auVar8[1] = '@' - local_1c8;
      auVar8[0] = local_1c8;
      auVar8[2] = cStack_1c7;
      auVar8[3] = '@' - cStack_1c7;
      auVar8[4] = cStack_1c6;
      auVar8[5] = '@' - cStack_1c6;
      auVar8[6] = cStack_1c5;
      auVar8[7] = '@' - cStack_1c5;
      auVar8[9] = '@' - cStack_1c4;
      auVar8[8] = cStack_1c4;
      auVar8[10] = cStack_1c3;
      auVar8[0xb] = '@' - cStack_1c3;
      auVar8[0xc] = cStack_1c2;
      auVar8[0xd] = '@' - cStack_1c2;
      auVar8[0xe] = cStack_1c1;
      auVar8[0xf] = '@' - cStack_1c1;
      pmaddubsw(auVar9,auVar8);
      alVar16[1] = in_RSI;
      alVar16[0] = 6;
      alVar16 = xx_roundn_epu16(alVar16,(int)in_RDX);
      uStack_f0 = (undefined1)uVar2;
      uStack_ef = (undefined1)((ulong)uVar2 >> 8);
      uStack_ee = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_ed = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_ec = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_eb = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_ea = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_e9 = (undefined1)((ulong)uVar2 >> 0x38);
      uStack_100 = (undefined1)uVar4;
      uStack_ff = (undefined1)((ulong)uVar4 >> 8);
      uStack_fe = (undefined1)((ulong)uVar4 >> 0x10);
      uStack_fd = (undefined1)((ulong)uVar4 >> 0x18);
      uStack_fc = (undefined1)((ulong)uVar4 >> 0x20);
      uStack_fb = (undefined1)((ulong)uVar4 >> 0x28);
      uStack_fa = (undefined1)((ulong)uVar4 >> 0x30);
      uStack_f9 = (undefined1)((ulong)uVar4 >> 0x38);
      auVar7[1] = uStack_100;
      auVar7[0] = uStack_f0;
      auVar7[2] = uStack_ef;
      auVar7[3] = uStack_ff;
      auVar7[4] = uStack_ee;
      auVar7[5] = uStack_fe;
      auVar7[6] = uStack_ed;
      auVar7[7] = uStack_fd;
      auVar7[9] = uStack_fc;
      auVar7[8] = uStack_ec;
      auVar7[10] = uStack_eb;
      auVar7[0xb] = uStack_fb;
      auVar7[0xc] = uStack_ea;
      auVar7[0xd] = uStack_fa;
      auVar7[0xe] = uStack_e9;
      auVar7[0xf] = uStack_f9;
      auVar14[1] = '@' - cStack_1c0;
      auVar14[0] = cStack_1c0;
      auVar14[2] = cStack_1bf;
      auVar14[3] = '@' - cStack_1bf;
      auVar14[4] = cStack_1be;
      auVar14[5] = '@' - cStack_1be;
      auVar14[6] = cStack_1bd;
      auVar14[7] = '@' - cStack_1bd;
      auVar14[9] = '@' - cStack_1bc;
      auVar14[8] = cStack_1bc;
      auVar14[10] = cStack_1bb;
      auVar14[0xb] = '@' - cStack_1bb;
      auVar14[0xc] = cStack_1ba;
      auVar14[0xd] = '@' - cStack_1ba;
      auVar14[0xe] = cStack_1b9;
      auVar14[0xf] = '@' - cStack_1b9;
      pmaddubsw(auVar7,auVar14);
      v_val_w[1] = in_RSI;
      v_val_w[0] = 6;
      alVar16 = xx_roundn_epu16(v_val_w,(int)alVar16[1]);
      in_RDX = alVar16[1];
      local_d8 = (short)extraout_XMM0_Qa;
      sStack_d6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_d4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_d2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_d0 = (short)extraout_XMM0_Qb;
      sStack_ce = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_cc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_ca = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      local_e8 = (short)extraout_XMM0_Qa_00;
      sStack_e6 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_e4 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_e2 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_e0 = (short)extraout_XMM0_Qb_00;
      sStack_de = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_dc = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_da = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      auVar10[1] = (0 < sStack_d6) * (sStack_d6 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                   (0xff < sStack_d6);
      auVar10[0] = (0 < local_d8) * (local_d8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_d8);
      auVar10[2] = (0 < sStack_d4) * (sStack_d4 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x20) -
                   (0xff < sStack_d4);
      auVar10[3] = (0 < sStack_d2) * (sStack_d2 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x30) -
                   (0xff < sStack_d2);
      auVar10[4] = (0 < sStack_d0) * (sStack_d0 < 0x100) * (char)extraout_XMM0_Qb -
                   (0xff < sStack_d0);
      auVar10[5] = (0 < sStack_ce) * (sStack_ce < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x10) -
                   (0xff < sStack_ce);
      auVar10[6] = (0 < sStack_cc) * (sStack_cc < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x20) -
                   (0xff < sStack_cc);
      auVar10[7] = (0 < sStack_ca) * (sStack_ca < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x30) -
                   (0xff < sStack_ca);
      auVar10[9] = (0 < sStack_e6) * (sStack_e6 < 0x100) *
                   (char)((ulong)extraout_XMM0_Qa_00 >> 0x10) - (0xff < sStack_e6);
      auVar10[8] = (0 < local_e8) * (local_e8 < 0x100) * (char)extraout_XMM0_Qa_00 -
                   (0xff < local_e8);
      auVar10[10] = (0 < sStack_e4) * (sStack_e4 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_00 >> 0x20) - (0xff < sStack_e4);
      auVar10[0xb] = (0 < sStack_e2) * (sStack_e2 < 0x100) *
                     (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) - (0xff < sStack_e2);
      auVar10[0xc] = (0 < sStack_e0) * (sStack_e0 < 0x100) * (char)extraout_XMM0_Qb_00 -
                     (0xff < sStack_e0);
      auVar10[0xd] = (0 < sStack_de) * (sStack_de < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_de);
      auVar10[0xe] = (0 < sStack_dc) * (sStack_dc < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_dc);
      auVar10[0xf] = (0 < sStack_da) * (sStack_da < 0x100) *
                     (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_da);
      auVar14 = psadbw(auVar10,auVar11);
      local_c8 = auVar14._0_4_;
      iStack_c0 = auVar14._8_4_;
      iVar13 = iVar13 + local_c8;
      iVar15 = iVar15 + iStack_c0;
    }
    local_1f0 = local_1f0 + iVar12;
    local_200 = local_200 + in_ECX;
    local_210 = local_210 + in_R9D;
    in_stack_00000008 = in_stack_00000008 + (int)pred[0];
  }
  return iVar13 + iVar15;
}

Assistant:

static inline unsigned int masked_sad_ssse3(const uint8_t *src_ptr,
                                            int src_stride,
                                            const uint8_t *a_ptr, int a_stride,
                                            const uint8_t *b_ptr, int b_stride,
                                            const uint8_t *m_ptr, int m_stride,
                                            int width, int height) {
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m = _mm_loadu_si128((const __m128i *)&m_ptr[x]);
      const __m128i m_inv = _mm_sub_epi8(mask_max, m);

      // Calculate 16 predicted pixels.
      // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
      // is 64 * 255, so we have plenty of space to add rounding constants.
      const __m128i data_l = _mm_unpacklo_epi8(a, b);
      const __m128i mask_l = _mm_unpacklo_epi8(m, m_inv);
      __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
      pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi8(a, b);
      const __m128i mask_r = _mm_unpackhi_epi8(m, m_inv);
      __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
      pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

      const __m128i pred = _mm_packus_epi16(pred_l, pred_r);
      res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  unsigned int sad = (unsigned int)(_mm_cvtsi128_si32(res) +
                                    _mm_cvtsi128_si32(_mm_srli_si128(res, 8)));
  return sad;
}